

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_typetraits_tests.cpp
# Opt level: O1

void __thiscall
iu_UnitTest_x_iutest_x_has_equal_to_Test::Body(iu_UnitTest_x_iutest_x_has_equal_to_Test *this)

{
  return;
}

Assistant:

IUTEST(UnitTest, has_equal_to)
{
    IUTEST_STATIC_ASSERT(  ::iutest_type_traits::has_equal_to<int>::value );
    IUTEST_STATIC_ASSERT(  ::iutest_type_traits::has_equal_to<float>::value );
    IUTEST_STATIC_ASSERT( !::iutest_type_traits::has_equal_to<X>::value );
    IUTEST_STATIC_ASSERT(  ::iutest_type_traits::has_equal_to<Y>::value );
    IUTEST_STATIC_ASSERT(  ::iutest_type_traits::has_equal_to<Z>::value );
    IUTEST_STATIC_ASSERT(  ::iutest_type_traits::has_equal_to< ::std::vector<int> >::value );
}